

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearizer.c
# Opt level: O0

Pseudo * linearize_function_expr(Proc *proc,AstNode *expr)

{
  Proc *proc_00;
  Proc *proc_01;
  Pseudo *pseudo;
  Pseudo *pPVar1;
  Instruction *insn_00;
  Pseudo *tofree;
  Instruction *insn;
  Pseudo *operand;
  Pseudo *target;
  ravitype_t target_type;
  Proc *newproc;
  Proc *curproc;
  AstNode *expr_local;
  Proc *proc_local;
  
  proc_00 = proc->linearizer->current_proc;
  proc_01 = allocate_proc(proc->linearizer,expr);
  set_current_proc(proc->linearizer,proc_01);
  linearize_function(proc->linearizer);
  set_current_proc(proc->linearizer,proc_00);
  pseudo = allocate_temp_pseudo(proc,(expr->field_2).common_expr.type.type_code,true);
  pPVar1 = allocate_closure_pseudo(proc_01);
  insn_00 = allocate_instruction(proc,op_closure,expr->line_number);
  pPVar1 = add_instruction_operand(proc,insn_00,pPVar1);
  add_instruction_target(proc,insn_00,pseudo);
  add_instruction(proc,insn_00);
  if (pPVar1 != (Pseudo *)0x0) {
    free_temp_pseudo(proc,pPVar1,false);
  }
  return pseudo;
}

Assistant:

static Pseudo *linearize_function_expr(Proc *proc, AstNode *expr)
{
	Proc *curproc = proc->linearizer->current_proc;
	Proc *newproc = allocate_proc(proc->linearizer, expr);
	set_current_proc(proc->linearizer, newproc);
	linearize_function(proc->linearizer);
	set_current_proc(proc->linearizer, curproc); // restore the proc
	ravitype_t target_type = expr->function_expr.type.type_code;
	Pseudo *target = allocate_temp_pseudo(proc, target_type, true);
	Pseudo *operand = allocate_closure_pseudo(newproc);
	Instruction *insn = allocate_instruction(proc, op_closure, expr->line_number);
	Pseudo *tofree = add_instruction_operand(proc, insn, operand);
	add_instruction_target(proc, insn, target);
	add_instruction(proc, insn);
	if (tofree)
		free_temp_pseudo(proc, tofree, false);
	return target;
}